

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *vec,size_t n_els,FILE **in)

{
  int iVar1;
  char *__ptr;
  size_t sVar2;
  undefined8 *in_RDX;
  size_t in_RSI;
  size_type in_RDI;
  bool bVar3;
  vector<signed_char,_std::allocator<signed_char>_> *unaff_retaddr;
  size_t n_read;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(unaff_retaddr,in_RDI);
  std::vector<signed_char,_std::allocator<signed_char>_>::shrink_to_fit
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x66227c);
  if (in_RSI != 0) {
    iVar1 = feof((FILE *)*in_RDX);
    if (iVar1 != 0) {
      throw_feoferr();
    }
    __ptr = std::vector<signed_char,_std::allocator<signed_char>_>::data
                      ((vector<signed_char,_std::allocator<signed_char>_> *)0x6622a9);
    sVar2 = fread(__ptr,1,in_RSI,(FILE *)*in_RDX);
    bVar3 = true;
    if (sVar2 == in_RSI) {
      iVar1 = ferror((FILE *)*in_RDX);
      bVar3 = iVar1 != 0;
    }
    if (bVar3) {
      throw_ferror((FILE *)0x662308);
    }
  }
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, FILE *&in)
{
    vec.resize(n_els);
    vec.shrink_to_fit();
    
    if (n_els) {
        if (unlikely(feof(in))) throw_feoferr();
        size_t n_read = fread(vec.data(), sizeof(dtype), n_els, in);
        if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);
    }
}